

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

axis * __thiscall mpt::convertable::operator_cast_to_axis_(convertable *this)

{
  int iVar1;
  axis *local_28;
  axis *ptr;
  convertable *pcStack_18;
  int type;
  convertable *this_local;
  
  pcStack_18 = this;
  ptr._4_4_ = type_properties<mpt::axis_*>::id(true);
  local_28 = (axis *)0x0;
  if ((0 < ptr._4_4_) &&
     (iVar1 = (**this->_vptr_convertable)(this,(long)ptr._4_4_,&local_28), -1 < iVar1)) {
    return local_28;
  }
  return (axis *)0x0;
}

Assistant:

mpt::convertable::operator T *()
{
	int type = mpt::type_properties<T *>::id(true);
	T *ptr = 0;
	if ((type <= 0) || (convert(type, &ptr) < 0)) {
		return 0;
	}
	return ptr;
}